

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getTimeZoneDisplayName
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType type,UnicodeString *name)

{
  UErrorCode UVar1;
  ZNames *this_00;
  UErrorCode status;
  ConstChar16Ptr local_40;
  Mutex lock;
  
  icu_63::UnicodeString::setToBogus(name);
  if (0x1f < (ushort)(tzID->fUnion).fStackFields.fLengthAndFlags) {
    lock.fMutex = (UMutex *)gDataMutex;
    umtx_lock_63((UMutex *)gDataMutex);
    status = U_ZERO_ERROR;
    this_00 = loadTimeZoneNames(this,tzID,&status);
    UVar1 = status;
    Mutex::~Mutex(&lock);
    if ((this_00 != (ZNames *)0x0) && (UVar1 < U_ILLEGAL_ARGUMENT_ERROR)) {
      local_40.p_ = ZNames::getName(this_00,type);
      if (local_40.p_ != (UChar *)0x0) {
        icu_63::UnicodeString::setTo(name,'\x01',&local_40,-1);
      }
    }
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getTimeZoneDisplayName(const UnicodeString& tzID, UTimeZoneNameType type, UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    if (tzID.isEmpty()) {
        return name;
    }

    ZNames *tznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        tznames = nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (tznames != NULL) {
        const UChar *s = tznames->getName(type);
        if (s != NULL) {
            name.setTo(TRUE, s, -1);
        }
    }
    return name;
}